

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O3

void test_writers(void)

{
  int fd;
  FILE *__stream;
  file_writer w_1;
  stream_writer w;
  ofstream f;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  stream_writer local_228;
  undefined1 local_218 [16];
  char local_208 [232];
  ios_base local_120 [264];
  
  std::ofstream::ofstream((ostream *)local_218,"test_files/tmp.json",_S_out);
  argo::stream_writer::stream_writer(&local_228,(ostream *)local_218);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"{ \"one\" : 1 }","");
  argo::operator<<(&local_228.super_writer,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p);
  }
  std::ofstream::close();
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"stream","");
  test_writer(&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  local_218._0_8_ = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18)) = __filebuf;
  std::filebuf::~filebuf((filebuf *)(local_218 + 8));
  std::ios_base::~ios_base(local_120);
  __stream = fopen("test_files/tmp.json","w");
  argo::file_writer::file_writer((file_writer *)&local_2a8,(FILE *)__stream);
  local_218._0_8_ = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"{ \"one\" : 1 }","");
  argo::operator<<((writer *)&local_2a8,(string *)local_218);
  if ((char *)local_218._0_8_ != local_208) {
    operator_delete((void *)local_218._0_8_);
  }
  fclose(__stream);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"file","");
  test_writer(&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  fd = open("test_files/tmp.json",0x41,0);
  argo::fd_writer::fd_writer((fd_writer *)&local_2a8,fd);
  local_218._0_8_ = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"{ \"one\" : 1 }","");
  argo::operator<<((writer *)&local_2a8,(string *)local_218);
  if ((char *)local_218._0_8_ != local_208) {
    operator_delete((void *)local_218._0_8_);
  }
  close(fd);
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"fd","");
  test_writer(&local_288);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p);
  }
  return;
}

Assistant:

void test_writers()
{
    {
        ofstream f("test_files/tmp.json");
        stream_writer w(&f);
        w << "{ \"one\" : 1 }";
        f.close();
        test_writer("stream");
    }

    {
        FILE *f = fopen("test_files/tmp.json", "w");
        file_writer w(f);
        w << "{ \"one\" : 1 }";
        fclose(f);
        test_writer("file");
    }

#ifndef _ARGO_WINDOWS_
    {
        int f = open("test_files/tmp.json", O_CREAT | O_WRONLY, 0);
        fd_writer w(f);
        w << "{ \"one\" : 1 }";
        close(f);
        test_writer("fd");
    }
#endif
}